

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O0

void __thiscall
Memory::HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>::HeapBucketT
          (HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_> *this)

{
  HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_> *this_local;
  
  HeapBucket::HeapBucket(&this->super_HeapBucket);
  SmallHeapBlockAllocator<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>::
  SmallHeapBlockAllocator(&this->allocatorHead);
  this->nextAllocableBlockHead = (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
  this->emptyBlockList = (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
  this->fullBlockList = (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
  this->heapBlockList = (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
  this->explicitFreeList = (FreeObject *)0x0;
  this->lastExplicitFreeListAllocator = (TBlockAllocatorType *)0x0;
  this->explicitFreeLockBlockList = (SmallHeapBlock *)0x0;
  this->isAllocationStopped = false;
  return;
}

Assistant:

HeapBucketT<TBlockType>::HeapBucketT() :
    nextAllocableBlockHead(nullptr),
    emptyBlockList(nullptr),
    fullBlockList(nullptr),
    heapBlockList(nullptr),
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
#if SUPPORT_WIN32_SLIST
    lastKnownNextAllocableBlockHead(nullptr),
    allocableHeapBlockListHead(nullptr),
    sweepableHeapBlockList(nullptr),
#endif
#endif
    explicitFreeList(nullptr),
    lastExplicitFreeListAllocator(nullptr)
{
#ifdef RECYCLER_PAGE_HEAP
    explicitFreeLockBlockList = nullptr;
#endif

    isAllocationStopped = false;
}